

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
* build_column_matrix<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>>>>
            (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
             *__return_storage_ptr__,
            vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
            *rows,Column_settings *settings)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  allocator_type local_6d;
  int local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  int local_4c;
  Column_settings *local_48;
  Column_z2_settings *local_40;
  vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
  *local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c = 0;
  local_38 = (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              *)0x100000000;
  uStack_30 = 0x500000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,__l,&local_6d);
  local_4c = 4;
  local_48 = settings;
  local_40 = (Column_z2_settings *)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,int,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>>>*,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
              *)__return_storage_ptr__,&local_6c,&local_68,&local_4c,
             (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              **)&local_40,&local_48);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_6c = 1;
  local_38 = (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              *)0x100000000;
  uStack_30 = 0x500000002;
  local_28 = 6;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,__l_00,&local_6d);
  local_4c = 4;
  local_48 = settings;
  local_40 = (Column_z2_settings *)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,int,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>>>*,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
              *)__return_storage_ptr__,&local_6c,&local_68,&local_4c,
             (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              **)&local_40,&local_48);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_6c = 2;
  local_38 = (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              *)0x100000000;
  uStack_30 = 0x500000002;
  local_28 = 6;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,__l_01,&local_6d);
  local_4c = 4;
  local_48 = settings;
  local_40 = (Column_z2_settings *)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,int,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>>>*,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
              *)__return_storage_ptr__,&local_6c,&local_68,&local_4c,
             (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              **)&local_40,&local_48);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_48 = (Column_settings *)CONCAT44(local_48._4_4_,3);
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c = 4;
  local_40 = settings;
  local_38 = rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,int,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>>>*,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
              *)__return_storage_ptr__,(int *)&local_48,&local_68,&local_6c,&local_38,&local_40);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_6c = 4;
  local_38 = (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              *)0x100000000;
  uStack_30 = 0x500000003;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,__l_02,&local_6d);
  local_4c = 4;
  local_48 = settings;
  local_40 = (Column_z2_settings *)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
  ::
  emplace_back<int,std::vector<unsigned_int,std::allocator<unsigned_int>>,int,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>>>*,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
              *)__return_storage_ptr__,&local_6c,&local_68,&local_4c,
             (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              **)&local_40,&local_48);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_38 = (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              *)CONCAT44(local_38._4_4_,5);
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)rows;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
  ::
  emplace_back<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>&,int,std::vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>>>>>*>
            ((vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>,std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,false>>>*,8ul,void,void>>>>
              *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,(int *)&local_38,
             (vector<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_false>_>_>_>_>_>_>
              **)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Column> build_column_matrix(Rows& rows, typename Column::Column_settings& settings) {
  std::vector<Column> matrix;

  if constexpr (is_z2<Column>()) {
    using cont = std::vector<unsigned int>;
    matrix.emplace_back(0, cont{0, 1, 3, 5}, 4, &rows, &settings);
    matrix.emplace_back(1, cont{0, 1, 2, 5, 6}, 4, &rows, &settings);
    matrix.emplace_back(2, cont{0, 1, 2, 5, 6}, 4, &rows, &settings);
    matrix.emplace_back(3, cont{}, 4, &rows, &settings);
    matrix.emplace_back(4, cont{0, 1, 3, 5}, 4, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  } else {
    using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;
    matrix.emplace_back(0, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, 4, &rows, &settings);
    matrix.emplace_back(1, cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, 4, &rows, &settings);
    matrix.emplace_back(2, cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, 4, &rows, &settings);
    matrix.emplace_back(3, cont{}, 4, &rows, &settings);
    matrix.emplace_back(4, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, 4, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  }

  return matrix;
}